

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcoluj.c
# Opt level: O0

int ffu8fr4(ULONGLONG *input,long ntodo,double scale,double zero,float *output,int *status)

{
  ULONGLONG UVar1;
  undefined1 auVar2 [16];
  float local_3c;
  long ii;
  int *status_local;
  float *output_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  ULONGLONG *input_local;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      UVar1 = input[ii];
      auVar2._8_4_ = (int)(UVar1 >> 0x20);
      auVar2._0_8_ = UVar1;
      auVar2._12_4_ = 0x45300000;
      output[ii] = (float)((((auVar2._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)UVar1) - 4503599627370496.0)) - zero)
                          / scale);
    }
  }
  else {
    for (ii = 0; ii < ntodo; ii = ii + 1) {
      local_3c = (float)input[ii];
      output[ii] = local_3c;
    }
  }
  return *status;
}

Assistant:

int ffu8fr4(ULONGLONG *input , /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            float *output,     /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
                output[ii] = (float) input[ii];
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
            output[ii] = (float) ((input[ii] - zero) / scale);
    }
    return(*status);
}